

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_bmp.c
# Opt level: O0

int bmp_read_1bit(gdImagePtr im,gdIOCtxPtr infile,bmp_info_t *info,bmp_hdr_t *header)

{
  int iVar1;
  int iVar2;
  long lVar3;
  longdouble in_ST0;
  int local_4c;
  uint local_48;
  int bit;
  int current_byte;
  int padding;
  int index;
  int row;
  int xpos;
  int ypos;
  bmp_hdr_t *header_local;
  bmp_info_t *info_local;
  gdIOCtxPtr infile_local;
  gdImagePtr im_local;
  
  row = 0;
  index = 0;
  padding = 0;
  current_byte = 0;
  bit = 0;
  local_48 = 0;
  if (info->enctype == 0) {
    if (info->numcolors == 0) {
      info->numcolors = 2;
    }
    else if ((info->numcolors < 0) || (2 < info->numcolors)) {
      return 1;
    }
    _xpos = header;
    header_local = (bmp_hdr_t *)info;
    info_local = (bmp_info_t *)infile;
    infile_local = (gdIOCtxPtr)im;
    iVar2 = bmp_read_palette(im,infile,info->numcolors,(uint)(info->type == 2));
    if (iVar2 == 0) {
      *(undefined4 *)&infile_local->putC = *(undefined4 *)&header_local[2].reserved1;
      lVar3 = gdTell((gdIOCtx *)info_local);
      if (lVar3 != _xpos->off) {
        gdSeek((gdIOCtx *)info_local,_xpos->off);
      }
      ceill();
      bit = (int)ROUND(in_ST0) % 4;
      if (bit != 0) {
        bit = 4 - bit;
      }
      for (row = 0; row < header_local->off; row = row + 1) {
        if ((char)header_local[1].magic == '\0') {
          padding = (header_local->off - row) + -1;
        }
        else {
          padding = row;
        }
        for (index = 0; iVar2._0_2_ = header_local->reserved1, iVar2._2_2_ = header_local->reserved2
            , index < iVar2; index = index + 8) {
          iVar2 = gdGetByte((int *)&local_48,(gdIOCtx *)info_local);
          if (iVar2 == 0) {
            return 1;
          }
          for (local_4c = 0; local_4c < 8; local_4c = local_4c + 1) {
            current_byte = (int)((local_48 & 0x80 >> ((byte)local_4c & 0x1f)) != 0);
            if (*(int *)((long)&infile_local[0x30].putC + (long)current_byte * 4 + 4) != 0) {
              *(undefined4 *)((long)&infile_local[0x30].putC + (long)current_byte * 4 + 4) = 0;
            }
            gdImageSetPixel((gdImagePtr)infile_local,index + local_4c,padding,current_byte);
            iVar1._0_2_ = header_local->reserved1;
            iVar1._2_2_ = header_local->reserved2;
            if (iVar1 <= index + local_4c) break;
          }
        }
        for (index = bit; 0 < index; index = index + -1) {
          iVar2 = gdGetByte(&current_byte,(gdIOCtx *)info_local);
          if (iVar2 == 0) {
            return 1;
          }
        }
      }
      im_local._4_4_ = 0;
    }
    else {
      im_local._4_4_ = 1;
    }
  }
  else {
    im_local._4_4_ = 1;
  }
  return im_local._4_4_;
}

Assistant:

static int bmp_read_1bit(gdImagePtr im, gdIOCtxPtr infile, bmp_info_t *info, bmp_hdr_t *header)
{
	int ypos = 0, xpos = 0, row = 0, index = 0;
	int padding = 0, current_byte = 0, bit = 0;

	if (info->enctype != BMP_BI_RGB) {
		return 1;
	}

	if (!info->numcolors) {
		info->numcolors = 2;
	} else if (info->numcolors < 0 || info->numcolors > 2) {
		return 1;
	}

	if (bmp_read_palette(im, infile, info->numcolors, (info->type == BMP_PALETTE_4))) {
		return 1;
	}

	im->colorsTotal = info->numcolors;

	/* There is a chance the data isn't until later, would be wierd but it is possible */
	if (gdTell(infile) != header->off) {
		/* Should make sure we don't seek past the file size */
		gdSeek(infile, header->off);
	}

	/* The line must be divisible by 4, else its padded with NULLs */
	padding = ((int)ceill(0.1 * info->width)) % 4;
	if (padding) {
		padding = 4 - padding;
	}

	for (ypos = 0; ypos < info->height; ++ypos) {
		if (info->topdown) {
			row = ypos;
		} else {
			row = info->height - ypos - 1;
		}

		for (xpos = 0; xpos < info->width; xpos += 8) {
			/* Bitmaps are always aligned in bytes so we'll never overflow */
			if (!gdGetByte(&current_byte, infile)) {
				return 1;
			}

			for (bit = 0; bit < 8; bit++) {
				index = ((current_byte & (0x80 >> bit)) != 0 ? 0x01 : 0x00);
				if (im->open[index]) {
					im->open[index] = 0;
				}
				gdImageSetPixel(im, xpos + bit, row, index);
				/* No need to read anything extra */
				if ((xpos + bit) >= info->width) {
					break;
				}
			}
		}

		for (xpos = padding; xpos > 0; --xpos) {
			if (!gdGetByte(&index, infile)) {
				return 1;
			}
		}
	}
	return 0;
}